

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmSourceFile * __thiscall
cmMakefile::AddCustomCommandToOutput
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *byproducts,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,string *main_dependency,cmCustomCommandLines *commandLines,char *comment,
          char *workingDir,bool replace,bool escapeOldStyle,bool uses_terminal,
          bool command_expand_lists,string *depfile)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ostream *poVar2;
  ulong uVar3;
  cmCustomCommand *pcVar4;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *pvVar5;
  cmGlobalGenerator *pcVar6;
  const_reference pvVar7;
  char *pcVar8;
  reference pbVar9;
  cmSourceFile *pcVar10;
  cmCustomCommand *cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends2;
  string local_2f0;
  cmSourceFile *local_2d0;
  cmSourceFile *out_1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2c0;
  const_iterator o_1;
  string local_2b0;
  cmSourceFile *local_290;
  cmSourceFile *out;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_280;
  const_iterator o;
  string local_270;
  int local_24c;
  undefined1 local_248 [8];
  string outName;
  cmGlobalGenerator *gg;
  cmSourceFile *file;
  ostringstream local_1e8 [8];
  ostringstream e;
  cmCustomCommandLine *cl;
  __normal_iterator<const_cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
  local_60;
  const_iterator i;
  bool command_expand_lists_local;
  bool uses_terminal_local;
  bool escapeOldStyle_local;
  bool replace_local;
  cmCustomCommandLines *commandLines_local;
  string *main_dependency_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *depends_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *byproducts_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs_local;
  cmMakefile *this_local;
  
  i._M_current._7_1_ = replace;
  i._M_current._6_1_ = escapeOldStyle;
  i._M_current._5_1_ = uses_terminal;
  i._M_current._4_1_ = command_expand_lists;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(outputs);
  if (bVar1) {
    cmSystemTools::Error
              ("Attempt to add a custom rule with no output!",(char *)0x0,(char *)0x0,(char *)0x0);
    this_local = (cmMakefile *)0x0;
  }
  else {
    local_60._M_current =
         (cmCustomCommandLine *)
         std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::begin
                   (&commandLines->
                     super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
    while( true ) {
      cl = (cmCustomCommandLine *)
           std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::end
                     (&commandLines->
                       super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
      bVar1 = __gnu_cxx::operator!=
                        (&local_60,
                         (__normal_iterator<const_cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
                          *)&cl);
      if (!bVar1) break;
      this_00 = &__gnu_cxx::
                 __normal_iterator<const_cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
                 ::operator*(&local_60)->
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(this_00);
      if (!bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](this_00,0);
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](this_00,0);
          pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)pvVar7);
          if (*pcVar8 == '\"') {
            std::__cxx11::ostringstream::ostringstream(local_1e8);
            poVar2 = std::operator<<((ostream *)local_1e8,
                                     "COMMAND may not contain literal quotes:\n  ");
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](this_00,0);
            poVar2 = std::operator<<(poVar2,(string *)pvVar7);
            std::operator<<(poVar2,"\n");
            std::__cxx11::ostringstream::str();
            IssueMessage(this,FATAL_ERROR,(string *)&file);
            std::__cxx11::string::~string((string *)&file);
            std::__cxx11::ostringstream::~ostringstream(local_1e8);
            return (cmSourceFile *)0x0;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
      ::operator++(&local_60);
    }
    gg = (cmGlobalGenerator *)0x0;
    bVar1 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::empty
                      (&commandLines->
                        super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
    if ((!bVar1) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
      gg = (cmGlobalGenerator *)GetSource(this,main_dependency);
      if ((gg == (cmGlobalGenerator *)0x0) ||
         ((pcVar4 = cmSourceFile::GetCustomCommand((cmSourceFile *)gg),
          pcVar4 == (cmCustomCommand *)0x0 || ((i._M_current._7_1_ & 1) != 0)))) {
        if (gg == (cmGlobalGenerator *)0x0) {
          gg = (cmGlobalGenerator *)CreateSource(this,main_dependency,false);
        }
      }
      else {
        pcVar4 = cmSourceFile::GetCustomCommand((cmSourceFile *)gg);
        pvVar5 = &cmCustomCommand::GetCommandLines(pcVar4)->
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>;
        bVar1 = std::operator==(&commandLines->
                                 super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                ,pvVar5);
        if (bVar1) {
          return (cmSourceFile *)gg;
        }
        gg = (cmGlobalGenerator *)0x0;
      }
    }
    if (gg == (cmGlobalGenerator *)0x0) {
      pcVar6 = GetGlobalGenerator(this);
      outName.field_2._8_8_ = pcVar6;
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](outputs,0);
      (*pcVar6->_vptr_cmGlobalGenerator[0x25])((string *)local_248,pcVar6,pvVar7);
      gg = (cmGlobalGenerator *)GetSource(this,(string *)local_248);
      if ((((cmMakefile *)gg == (cmMakefile *)0x0) ||
          (pcVar4 = cmSourceFile::GetCustomCommand((cmSourceFile *)gg),
          pcVar4 == (cmCustomCommand *)0x0)) || ((i._M_current._7_1_ & 1) != 0)) {
        if ((cmMakefile *)gg == (cmMakefile *)0x0) {
          gg = (cmGlobalGenerator *)CreateSource(this,(string *)local_248,true);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_270,"__CMAKE_RULE",(allocator *)((long)&o._M_current + 7));
        cmSourceFile::SetProperty((cmSourceFile *)gg,&local_270,"1");
        std::__cxx11::string::~string((string *)&local_270);
        std::allocator<char>::~allocator((allocator<char> *)((long)&o._M_current + 7));
        local_24c = 0;
      }
      else {
        pcVar4 = cmSourceFile::GetCustomCommand((cmSourceFile *)gg);
        pvVar5 = &cmCustomCommand::GetCommandLines(pcVar4)->
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>;
        bVar1 = std::operator!=(&commandLines->
                                 super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                ,pvVar5);
        if (bVar1) {
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmSystemTools::Error
                    ("Attempt to add a custom rule to output \"",pcVar8,
                     "\" which already has a custom rule.",(char *)0x0);
        }
        local_24c = 1;
        this_local = (cmMakefile *)gg;
      }
      std::__cxx11::string::~string((string *)local_248);
      if (local_24c != 0) {
        return (cmSourceFile *)this_local;
      }
    }
    local_280._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(outputs);
    while( true ) {
      out = (cmSourceFile *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(outputs);
      bVar1 = __gnu_cxx::operator!=
                        (&local_280,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&out);
      if (!bVar1) break;
      pbVar9 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_280);
      pcVar10 = GetOrCreateSource(this,pbVar9,true);
      local_290 = pcVar10;
      if (pcVar10 != (cmSourceFile *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_2b0,"GENERATED",(allocator *)((long)&o_1._M_current + 7));
        cmSourceFile::SetProperty(pcVar10,&local_2b0,"1");
        std::__cxx11::string::~string((string *)&local_2b0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&o_1._M_current + 7));
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_280);
    }
    local_2c0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(byproducts);
    while( true ) {
      out_1 = (cmSourceFile *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(byproducts);
      bVar1 = __gnu_cxx::operator!=
                        (&local_2c0,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&out_1);
      if (!bVar1) break;
      pbVar9 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_2c0);
      pcVar10 = GetOrCreateSource(this,pbVar9,true);
      local_2d0 = pcVar10;
      if (pcVar10 != (cmSourceFile *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_2f0,"GENERATED",
                   (allocator *)
                   ((long)&depends2.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmSourceFile::SetProperty(pcVar10,&local_2f0,"1");
        std::__cxx11::string::~string((string *)&local_2f0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&depends2.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_2c0);
    }
    if (gg != (cmGlobalGenerator *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&cc,depends);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&cc,main_dependency);
      }
      pcVar4 = (cmCustomCommand *)operator_new(0x100);
      cmCustomCommand::cmCustomCommand
                (pcVar4,this,outputs,byproducts,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&cc,commandLines,comment,workingDir);
      cmCustomCommand::SetEscapeOldStyle(pcVar4,(bool)(i._M_current._6_1_ & 1));
      cmCustomCommand::SetEscapeAllowMakeVars(pcVar4,true);
      cmCustomCommand::SetUsesTerminal(pcVar4,(bool)(i._M_current._5_1_ & 1));
      cmCustomCommand::SetCommandExpandLists(pcVar4,(bool)(i._M_current._4_1_ & 1));
      cmCustomCommand::SetDepfile(pcVar4,depfile);
      cmSourceFile::SetCustomCommand((cmSourceFile *)gg,pcVar4);
      UpdateOutputToSourceMap(this,outputs,(cmSourceFile *)gg);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cc);
    }
    this_local = (cmMakefile *)gg;
  }
  return (cmSourceFile *)this_local;
}

Assistant:

cmSourceFile* cmMakefile::AddCustomCommandToOutput(
  const std::vector<std::string>& outputs,
  const std::vector<std::string>& byproducts,
  const std::vector<std::string>& depends, const std::string& main_dependency,
  const cmCustomCommandLines& commandLines, const char* comment,
  const char* workingDir, bool replace, bool escapeOldStyle,
  bool uses_terminal, bool command_expand_lists, const std::string& depfile)
{
  // Make sure there is at least one output.
  if (outputs.empty()) {
    cmSystemTools::Error("Attempt to add a custom rule with no output!");
    return CM_NULLPTR;
  }

  // Validate custom commands.  TODO: More strict?
  for (cmCustomCommandLines::const_iterator i = commandLines.begin();
       i != commandLines.end(); ++i) {
    cmCustomCommandLine const& cl = *i;
    if (!cl.empty() && !cl[0].empty() && cl[0][0] == '"') {
      std::ostringstream e;
      e << "COMMAND may not contain literal quotes:\n  " << cl[0] << "\n";
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
      return CM_NULLPTR;
    }
  }

  // Choose a source file on which to store the custom command.
  cmSourceFile* file = CM_NULLPTR;
  if (!commandLines.empty() && !main_dependency.empty()) {
    // The main dependency was specified.  Use it unless a different
    // custom command already used it.
    file = this->GetSource(main_dependency);
    if (file && file->GetCustomCommand() && !replace) {
      // The main dependency already has a custom command.
      if (commandLines == file->GetCustomCommand()->GetCommandLines()) {
        // The existing custom command is identical.  Silently ignore
        // the duplicate.
        return file;
      }
      // The existing custom command is different.  We need to
      // generate a rule file for this new command.
      file = CM_NULLPTR;
    } else if (!file) {
      file = this->CreateSource(main_dependency);
    }
  }

  // Generate a rule file if the main dependency is not available.
  if (!file) {
    cmGlobalGenerator* gg = this->GetGlobalGenerator();

    // Construct a rule file associated with the first output produced.
    std::string outName = gg->GenerateRuleFile(outputs[0]);

    // Check if the rule file already exists.
    file = this->GetSource(outName);
    if (file && file->GetCustomCommand() && !replace) {
      // The rule file already exists.
      if (commandLines != file->GetCustomCommand()->GetCommandLines()) {
        cmSystemTools::Error("Attempt to add a custom rule to output \"",
                             outName.c_str(),
                             "\" which already has a custom rule.");
      }
      return file;
    }

    // Create a cmSourceFile for the rule file.
    if (!file) {
      file = this->CreateSource(outName, true);
    }
    file->SetProperty("__CMAKE_RULE", "1");
  }

  // Always create the output sources and mark them generated.
  for (std::vector<std::string>::const_iterator o = outputs.begin();
       o != outputs.end(); ++o) {
    if (cmSourceFile* out = this->GetOrCreateSource(*o, true)) {
      out->SetProperty("GENERATED", "1");
    }
  }
  for (std::vector<std::string>::const_iterator o = byproducts.begin();
       o != byproducts.end(); ++o) {
    if (cmSourceFile* out = this->GetOrCreateSource(*o, true)) {
      out->SetProperty("GENERATED", "1");
    }
  }

  // Attach the custom command to the file.
  if (file) {
    // Construct a complete list of dependencies.
    std::vector<std::string> depends2(depends);
    if (!main_dependency.empty()) {
      depends2.push_back(main_dependency);
    }

    cmCustomCommand* cc = new cmCustomCommand(
      this, outputs, byproducts, depends2, commandLines, comment, workingDir);
    cc->SetEscapeOldStyle(escapeOldStyle);
    cc->SetEscapeAllowMakeVars(true);
    cc->SetUsesTerminal(uses_terminal);
    cc->SetCommandExpandLists(command_expand_lists);
    cc->SetDepfile(depfile);
    file->SetCustomCommand(cc);
    this->UpdateOutputToSourceMap(outputs, file);
  }
  return file;
}